

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O3

void ggml_opt_result_free(ggml_opt_result_t result)

{
  pointer piVar1;
  pointer pfVar2;
  
  if (result != (ggml_opt_result_t)0x0) {
    piVar1 = (result->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar1 != (pointer)0x0) {
      operator_delete(piVar1,(long)(result->pred).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1)
      ;
    }
    pfVar2 = (result->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pfVar2 != (pointer)0x0) {
      operator_delete(pfVar2,(long)(result->loss).super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pfVar2)
      ;
    }
  }
  operator_delete(result,0x50);
  return;
}

Assistant:

void ggml_opt_result_free(ggml_opt_result_t result) {
    delete result;
}